

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O3

MPP_RET enc_impl_sw_enc(EncImpl impl,HalEncTask *task)

{
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar1;
  undefined8 in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (impl == (EncImpl)0x0 || task == (HalEncTask *)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_sw_enc",in_R8,in_R9,
               CONCAT71((int7)((ulong)in_RAX >> 8),impl != (EncImpl)0x0));
    return MPP_ERR_NULL_PTR;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)impl + 0x18) + 0x58);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    MVar1 = (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)impl + 0x20));
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET enc_impl_sw_enc(EncImpl impl, HalEncTask *task)
{
    if (NULL == impl || NULL == task) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;
    if (p->api->sw_enc)
        ret = p->api->sw_enc(p->ctx, task);

    return ret;
}